

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O0

int asio_service_test::response_hint_test(bool with_meta)

{
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_01;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_02;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  void *pvVar5;
  reference ppRVar6;
  TestSm *pTVar7;
  element_type *peVar8;
  int __how;
  int __how_00;
  int __how_01;
  undefined8 uVar9;
  byte in_DIL;
  allocator<char> *this;
  int _gt_3;
  int _sm_3;
  int _gt_2;
  int _sm_2;
  int _gt_1;
  int _sm_1;
  int _gt;
  int _sm;
  buffer_serializer bs_2;
  ptr<buffer> msg_2;
  string msg_str_2;
  size_t ii_2;
  raft_params params;
  RaftAsioPkg *ee_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range1_3;
  buffer_serializer bs_1;
  ptr<buffer> msg_1;
  string msg_str_1;
  size_t ii_1;
  RaftAsioPkg *ee_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range1_2;
  buffer_serializer bs;
  ptr<buffer> msg;
  string msg_str;
  size_t ii;
  size_t NUM;
  int _v_4;
  int _ev_2;
  int _v_3;
  int _ev_1;
  int _v_2;
  int _ev;
  int _v_1;
  RaftAsioPkg *ee_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range1_1;
  int _v;
  RaftAsioPkg *ee;
  iterator __end1;
  iterator __begin1;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range1;
  atomic<unsigned_long> write_resp_cb_count;
  atomic<unsigned_long> read_resp_cb_count;
  atomic<unsigned_long> write_req_cb_count;
  atomic<unsigned_long> read_req_cb_count;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  RaftAsioPkg s3;
  RaftAsioPkg s2;
  RaftAsioPkg s1;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  memory_order __b_7;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  raft_server *in_stack_ffffffffffffdd48;
  TestSm *in_stack_ffffffffffffdd50;
  _Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>
  *in_stack_ffffffffffffdd58;
  raft_server *in_stack_ffffffffffffdd60;
  undefined4 in_stack_ffffffffffffdd68;
  undefined4 in_stack_ffffffffffffdd6c;
  WRITE_META_FUNC *in_stack_ffffffffffffdd70;
  __pthread_internal_list *p_Var10;
  undefined4 in_stack_ffffffffffffdd78;
  undefined4 in_stack_ffffffffffffdd7c;
  WRITE_META_FUNC *in_stack_ffffffffffffdd80;
  READ_META_FUNC *in_stack_ffffffffffffdd88;
  long *plVar11;
  undefined4 in_stack_ffffffffffffdd90;
  undefined4 in_stack_ffffffffffffdd94;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *in_stack_ffffffffffffddb0;
  raft_server *in_stack_ffffffffffffddb8;
  raft_server *in_stack_ffffffffffffddc0;
  size_t in_stack_ffffffffffffde98;
  undefined1 check_precommit;
  undefined4 in_stack_ffffffffffffdea0;
  undefined4 in_stack_ffffffffffffdea4;
  TestSm *in_stack_ffffffffffffdea8;
  init_options *in_stack_ffffffffffffdf28;
  undefined8 in_stack_ffffffffffffdf30;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *in_stack_ffffffffffffdf38;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *in_stack_ffffffffffffdf48;
  undefined8 ****local_1a58;
  undefined8 ****local_1788;
  undefined8 ****local_14c0;
  undefined1 local_d71 [33];
  native_handle_type local_d50;
  char local_d45;
  int local_d44;
  string local_d40 [32];
  int local_d20;
  int local_d1c;
  native_handle_type local_d18;
  char local_d0d;
  int local_d0c;
  string local_d08 [56];
  string local_cd0 [56];
  string local_c98 [32];
  int local_c78;
  int local_c74;
  native_handle_type local_c70;
  char local_c65;
  int local_c64;
  string local_c60 [48];
  string local_c30 [39];
  allocator local_c09;
  string local_c08 [40];
  undefined8 ***local_be0 [2];
  undefined1 ****local_bd0;
  undefined8 local_bc8;
  string local_b70 [32];
  string local_b50 [32];
  ulong local_b30;
  raft_params local_b24;
  allocator local_ab9;
  string local_ab8 [32];
  RaftAsioPkg *local_a98;
  RaftAsioPkg **local_a90;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  local_a88;
  undefined1 *local_a80;
  native_handle_type local_a78;
  char local_a6d;
  int local_a6c;
  string local_a68 [32];
  native_handle_type local_a48;
  char local_a3d;
  int local_a3c;
  string local_a38 [39];
  allocator local_a11;
  string local_a10 [40];
  undefined8 ***local_9e8 [2];
  undefined1 ****local_9d8;
  undefined8 local_9d0;
  string local_978 [32];
  string local_958 [32];
  ulong local_938;
  RaftAsioPkg *local_930;
  RaftAsioPkg **local_928;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  local_920;
  undefined1 *local_918;
  native_handle_type local_910;
  char local_905;
  int local_904;
  string local_900 [32];
  native_handle_type local_8e0;
  char local_8d5;
  int local_8d4;
  string local_8d0 [39];
  allocator local_8a9;
  string local_8a8 [40];
  undefined8 ***local_880 [2];
  undefined1 ****local_870;
  undefined8 local_868;
  string local_810 [32];
  ulong local_7f0;
  undefined8 local_7e8;
  allocator local_7d9;
  string local_7d8 [32];
  native_handle_type local_7b8;
  char local_7ad;
  int local_7ac;
  string local_7a8 [32];
  int32 local_788;
  int local_784;
  native_handle_type local_780;
  char local_775;
  int local_774;
  string local_770 [32];
  int32 local_750;
  int local_74c;
  native_handle_type local_748;
  char local_73d;
  int local_73c;
  string local_738 [32];
  int32 local_718;
  int local_714;
  native_handle_type local_710;
  char local_705;
  int local_704;
  string local_700 [32];
  native_handle_type local_6e0;
  char local_6d5;
  int local_6d4;
  string local_6d0 [36];
  int local_6ac;
  RaftAsioPkg *local_6a8;
  RaftAsioPkg **local_6a0;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  local_698;
  undefined1 *local_690;
  undefined4 local_684;
  native_handle_type local_680;
  char local_675;
  int local_674;
  string local_670 [84];
  int local_61c;
  undefined1 *local_618;
  undefined1 *local_5e0;
  undefined1 *local_5a8;
  thread *local_570;
  RaftAsioPkg *local_538;
  RaftAsioPkg **local_530;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  local_528;
  undefined1 *local_520;
  undefined1 local_518 [24];
  thread local_500 [2];
  EventAwaiter *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  EventAwaiter **local_4d8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_4d0;
  undefined1 local_4c8 [24];
  undefined1 local_4b0 [288];
  undefined1 local_390 [288];
  EventAwaiter local_270 [3];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [55];
  allocator local_e9;
  string local_e8 [35];
  byte local_c5;
  int local_c4;
  _func_int **local_c0;
  __native_type local_b8;
  __native_type local_90;
  __native_type local_68;
  memory_order local_40;
  undefined4 local_3c;
  undefined1 *local_38;
  memory_order local_28;
  undefined4 local_24;
  _Base_ptr local_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined8 local_8;
  
  local_c5 = in_DIL & 1;
  raft_functional_common::reset_log_files();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"localhost:20010",&local_e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"localhost:20020",&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"localhost:20030",&local_149);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  RaftAsioPkg::RaftAsioPkg
            ((RaftAsioPkg *)in_stack_ffffffffffffdd60,
             (int)((ulong)in_stack_ffffffffffffdd58 >> 0x20),(string *)in_stack_ffffffffffffdd50);
  RaftAsioPkg::RaftAsioPkg
            ((RaftAsioPkg *)in_stack_ffffffffffffdd60,
             (int)((ulong)in_stack_ffffffffffffdd58 >> 0x20),(string *)in_stack_ffffffffffffdd50);
  RaftAsioPkg::RaftAsioPkg
            ((RaftAsioPkg *)in_stack_ffffffffffffdd60,
             (int)((ulong)in_stack_ffffffffffffdd58 >> 0x20),(string *)in_stack_ffffffffffffdd50);
  local_4f0 = local_270;
  local_4e8 = local_390;
  local_4e0 = local_4b0;
  local_4d8 = &local_4f0;
  local_4d0.__d.__r = (duration)3;
  std::allocator<RaftAsioPkg_*>::allocator((allocator<RaftAsioPkg_*> *)0x1987cd);
  __l._M_len._0_4_ = in_stack_ffffffffffffdd90;
  __l._M_array = (iterator)in_stack_ffffffffffffdd88;
  __l._M_len._4_4_ = in_stack_ffffffffffffdd94;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_ffffffffffffdd80,__l,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffdd7c,in_stack_ffffffffffffdd78));
  std::allocator<RaftAsioPkg_*>::~allocator((allocator<RaftAsioPkg_*> *)0x198801);
  TestSuite::_msg("launching asio-raft servers %s\n");
  memset(local_500,0,8);
  memset(local_518 + 0x10,0,8);
  memset(local_518 + 8,0,8);
  memset(local_518,0,8);
  local_520 = local_4c8;
  local_528._M_current =
       (RaftAsioPkg **)
       std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
                 ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_ffffffffffffdd48
                 );
  local_530 = (RaftAsioPkg **)
              std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                        ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                         in_stack_ffffffffffffdd48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                             *)in_stack_ffffffffffffdd50,
                            (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                             *)in_stack_ffffffffffffdd48), bVar1) {
    ppRVar6 = __gnu_cxx::
              __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
              ::operator*(&local_528);
    local_538 = *ppRVar6;
    if ((local_c5 & 1) != 0) {
      local_570 = local_500;
      std::
      bind<bool(&)(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&),std::atomic<unsigned_long>*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((_func_bool_atomic<unsigned_long>_ptr_asio_service_meta_cb_params_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                  *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
                 (atomic<unsigned_long> **)in_stack_ffffffffffffdd60,
                 (_Placeholder<1> *)in_stack_ffffffffffffdd58,
                 (_Placeholder<2> *)in_stack_ffffffffffffdd50);
      std::function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>::
      function<std::_Bind<bool(*(std::atomic<unsigned_long>*,std::_Placeholder<1>,std::_Placeholder<2>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>,void>
                ((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_stack_ffffffffffffdd60,
                 (_Bind<bool_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_stack_ffffffffffffdd58);
      local_5a8 = local_518 + 0x10;
      std::
      bind<std::__cxx11::string(&)(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&),std::atomic<unsigned_long>*,std::_Placeholder<1>const&>
                ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_atomic<unsigned_long>_ptr_asio_service_meta_cb_params_ptr
                  *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
                 (atomic<unsigned_long> **)in_stack_ffffffffffffdd60,
                 (_Placeholder<1> *)in_stack_ffffffffffffdd58);
      std::function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)>::
      function<std::_Bind<std::__cxx11::string(*(std::atomic<unsigned_long>*,std::_Placeholder<1>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&)>,void>
                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                  *)in_stack_ffffffffffffdd60,in_stack_ffffffffffffdd58);
      local_5e0 = local_518 + 8;
      std::
      bind<bool(&)(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&),std::atomic<unsigned_long>*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((_func_bool_atomic<unsigned_long>_ptr_asio_service_meta_cb_params_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                  *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
                 (atomic<unsigned_long> **)in_stack_ffffffffffffdd60,
                 (_Placeholder<1> *)in_stack_ffffffffffffdd58,
                 (_Placeholder<2> *)in_stack_ffffffffffffdd50);
      std::function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>::
      function<std::_Bind<bool(*(std::atomic<unsigned_long>*,std::_Placeholder<1>,std::_Placeholder<2>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>,void>
                ((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_stack_ffffffffffffdd60,
                 (_Bind<bool_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_stack_ffffffffffffdd58);
      local_618 = local_518;
      std::
      bind<std::__cxx11::string(&)(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&),std::atomic<unsigned_long>*,std::_Placeholder<1>const&>
                ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_atomic<unsigned_long>_ptr_asio_service_meta_cb_params_ptr
                  *)CONCAT44(in_stack_ffffffffffffdd6c,in_stack_ffffffffffffdd68),
                 (atomic<unsigned_long> **)in_stack_ffffffffffffdd60,
                 (_Placeholder<1> *)in_stack_ffffffffffffdd58);
      std::function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)>::
      function<std::_Bind<std::__cxx11::string(*(std::atomic<unsigned_long>*,std::_Placeholder<1>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&)>,void>
                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                  *)in_stack_ffffffffffffdd60,in_stack_ffffffffffffdd58);
      RaftAsioPkg::setMetaCallback
                ((RaftAsioPkg *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                 in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd80,
                 (READ_META_FUNC *)CONCAT44(in_stack_ffffffffffffdd7c,in_stack_ffffffffffffdd78),
                 in_stack_ffffffffffffdd70,SUB41((uint)in_stack_ffffffffffffdd6c >> 0x18,0));
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                   *)0x198a8b);
      std::
      function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)0x198a98);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                   *)0x198aa5);
      std::
      function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)0x198ab2);
    }
    __gnu_cxx::
    __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>::
    operator++(&local_528);
  }
  nuraft::raft_server::init_options::init_options((init_options *)in_stack_ffffffffffffdd50);
  iVar2 = launch_servers(in_stack_ffffffffffffdf38,SUB81((ulong)in_stack_ffffffffffffdf30 >> 0x38,0)
                         ,SUB81((ulong)in_stack_ffffffffffffdf30 >> 0x30,0),
                         SUB81((ulong)in_stack_ffffffffffffdf30 >> 0x28,0),in_stack_ffffffffffffdf28
                        );
  nuraft::raft_server::init_options::~init_options((init_options *)0x198c99);
  local_61c = iVar2;
  if (iVar2 == 0) {
    TestSuite::_msg("enable batch size hint with positive value\n");
    local_690 = local_4c8;
    local_698._M_current =
         (RaftAsioPkg **)
         std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
                   ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                    in_stack_ffffffffffffdd48);
    local_6a0 = (RaftAsioPkg **)
                std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                          ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                           in_stack_ffffffffffffdd48);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                               *)in_stack_ffffffffffffdd50,
                              (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                               *)in_stack_ffffffffffffdd48), bVar1) {
      ppRVar6 = __gnu_cxx::
                __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                ::operator*(&local_698);
      local_6a8 = *ppRVar6;
      RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19923d);
      raft_functional_common::TestSm::set_next_batch_size_hint_in_bytes
                (in_stack_ffffffffffffdd50,(ulong)in_stack_ffffffffffffdd48);
      __gnu_cxx::
      __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
      ::operator++(&local_698);
    }
    TestSuite::_msg("organizing raft group\n");
    local_6ac = make_group(in_stack_ffffffffffffdf48);
    if (local_6ac == 0) {
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x199793);
      bVar1 = nuraft::raft_server::is_leader(in_stack_ffffffffffffdd48);
      if (bVar1) {
        local_714 = 1;
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x199ca4);
        local_718 = nuraft::raft_server::get_leader(in_stack_ffffffffffffdd48);
        if (local_714 == local_718) {
          local_74c = 1;
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x19a1c6);
          local_750 = nuraft::raft_server::get_leader(in_stack_ffffffffffffdd48);
          if (local_74c == local_750) {
            local_784 = 1;
            std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x19a6e8);
            local_788 = nuraft::raft_server::get_leader(in_stack_ffffffffffffdd48);
            if (local_784 == local_788) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_7d8,"wait for Raft group ready",&local_7d9);
              TestSuite::sleep_sec
                        ((size_t)in_stack_ffffffffffffdd50,(string *)in_stack_ffffffffffffdd48);
              std::__cxx11::string::~string(local_7d8);
              std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
              local_7e8 = 100;
              for (local_7f0 = 0; local_7f0 < 100; local_7f0 = local_7f0 + 1) {
                std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffdd88);
                std::__cxx11::string::size();
                nuraft::buffer::alloc(in_stack_ffffffffffffde98);
                nuraft::buffer_serializer::buffer_serializer
                          ((buffer_serializer *)in_stack_ffffffffffffdd60,
                           (ptr<buffer> *)in_stack_ffffffffffffdd58,
                           (endianness)((ulong)in_stack_ffffffffffffdd50 >> 0x20));
                nuraft::buffer_serializer::put_str
                          ((buffer_serializer *)in_stack_ffffffffffffdd60,
                           (string *)in_stack_ffffffffffffdd58);
                std::
                __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x19acf1);
                std::shared_ptr<nuraft::buffer>::shared_ptr
                          ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffdd50,
                           (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffdd48);
                local_868 = 1;
                local_870 = (undefined1 ****)local_880;
                std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
                          ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x19ad47);
                __l_00._M_len._0_4_ = in_stack_ffffffffffffdd90;
                __l_00._M_array = (iterator)in_stack_ffffffffffffdd88;
                __l_00._M_len._4_4_ = in_stack_ffffffffffffdd94;
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          *)in_stack_ffffffffffffdd80,__l_00,
                         (allocator_type *)
                         CONCAT44(in_stack_ffffffffffffdd7c,in_stack_ffffffffffffdd78));
                nuraft::raft_server::append_entries
                          (in_stack_ffffffffffffddb8,in_stack_ffffffffffffddb0);
                std::
                shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                               *)0x19ad9a);
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           *)in_stack_ffffffffffffdd60);
                std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
                          ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x19adb4);
                local_14c0 = &local_870;
                do {
                  local_14c0 = local_14c0 + -2;
                  std::shared_ptr<nuraft::buffer>::~shared_ptr
                            ((shared_ptr<nuraft::buffer> *)0x19ade9);
                } while (local_14c0 != local_880);
                std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x19ae13)
                ;
                std::__cxx11::string::~string(local_810);
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_8a8,"wait for replication",&local_8a9);
              TestSuite::sleep_sec
                        ((size_t)in_stack_ffffffffffffdd50,(string *)in_stack_ffffffffffffdd48);
              std::__cxx11::string::~string(local_8a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
              RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19afd9);
              RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19aff0);
              bVar1 = raft_functional_common::TestSm::isSame
                                (in_stack_ffffffffffffdea8,
                                 (TestSm *)
                                 CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
                                 SUB81(in_stack_ffffffffffffde98 >> 0x38,0));
              if (bVar1) {
                RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19b558);
                RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19b56f);
                bVar1 = raft_functional_common::TestSm::isSame
                                  (in_stack_ffffffffffffdea8,
                                   (TestSm *)
                                   CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
                                   SUB81(in_stack_ffffffffffffde98 >> 0x38,0));
                if (bVar1) {
                  TestSuite::_msg("disable batch size hint\n");
                  local_918 = local_4c8;
                  local_920._M_current =
                       (RaftAsioPkg **)
                       std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
                                 ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                                  in_stack_ffffffffffffdd48);
                  local_928 = (RaftAsioPkg **)
                              std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                                        ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                                         in_stack_ffffffffffffdd48);
                  while (bVar1 = __gnu_cxx::operator!=
                                           ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                                             *)in_stack_ffffffffffffdd50,
                                            (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                                             *)in_stack_ffffffffffffdd48), bVar1) {
                    ppRVar6 = __gnu_cxx::
                              __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                              ::operator*(&local_920);
                    local_930 = *ppRVar6;
                    RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19bb0b);
                    raft_functional_common::TestSm::set_next_batch_size_hint_in_bytes
                              (in_stack_ffffffffffffdd50,(ulong)in_stack_ffffffffffffdd48);
                    __gnu_cxx::
                    __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                    ::operator++(&local_920);
                  }
                  for (local_938 = 0; local_938 < 100; local_938 = local_938 + 1) {
                    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffdd88);
                    std::operator+((char *)in_stack_ffffffffffffdd58,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffdd50);
                    std::__cxx11::string::~string(local_978);
                    std::__cxx11::string::size();
                    nuraft::buffer::alloc(in_stack_ffffffffffffde98);
                    nuraft::buffer_serializer::buffer_serializer
                              ((buffer_serializer *)in_stack_ffffffffffffdd60,
                               (ptr<buffer> *)in_stack_ffffffffffffdd58,
                               (endianness)((ulong)in_stack_ffffffffffffdd50 >> 0x20));
                    nuraft::buffer_serializer::put_str
                              ((buffer_serializer *)in_stack_ffffffffffffdd60,
                               (string *)in_stack_ffffffffffffdd58);
                    std::
                    __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x19bbf6);
                    std::shared_ptr<nuraft::buffer>::shared_ptr
                              ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffdd50,
                               (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffdd48);
                    local_9d0 = 1;
                    local_9d8 = (undefined1 ****)local_9e8;
                    std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
                              ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x19bc4c);
                    __l_01._M_len._0_4_ = in_stack_ffffffffffffdd90;
                    __l_01._M_array = (iterator)in_stack_ffffffffffffdd88;
                    __l_01._M_len._4_4_ = in_stack_ffffffffffffdd94;
                    std::
                    vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                              *)in_stack_ffffffffffffdd80,__l_01,
                             (allocator_type *)
                             CONCAT44(in_stack_ffffffffffffdd7c,in_stack_ffffffffffffdd78));
                    nuraft::raft_server::append_entries
                              (in_stack_ffffffffffffddb8,in_stack_ffffffffffffddb0);
                    std::
                    shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                    ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                                   *)0x19bc9f);
                    std::
                    vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                               *)in_stack_ffffffffffffdd60);
                    std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
                              ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x19bcb9);
                    local_1788 = &local_9d8;
                    do {
                      local_1788 = local_1788 + -2;
                      std::shared_ptr<nuraft::buffer>::~shared_ptr
                                ((shared_ptr<nuraft::buffer> *)0x19bcee);
                    } while (local_1788 != local_9e8);
                    std::shared_ptr<nuraft::buffer>::~shared_ptr
                              ((shared_ptr<nuraft::buffer> *)0x19bd18);
                    std::__cxx11::string::~string(local_958);
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_a10,"wait for replication",&local_a11);
                  TestSuite::sleep_sec
                            ((size_t)in_stack_ffffffffffffdd50,(string *)in_stack_ffffffffffffdd48);
                  std::__cxx11::string::~string(local_a10);
                  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
                  RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19bebb);
                  RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19bed2);
                  bVar1 = raft_functional_common::TestSm::isSame
                                    (in_stack_ffffffffffffdea8,
                                     (TestSm *)
                                     CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
                                     SUB81(in_stack_ffffffffffffde98 >> 0x38,0));
                  if (bVar1) {
                    RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19c43a);
                    RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19c451);
                    bVar1 = raft_functional_common::TestSm::isSame
                                      (in_stack_ffffffffffffdea8,
                                       (TestSm *)
                                       CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0)
                                       ,SUB81(in_stack_ffffffffffffde98 >> 0x38,0));
                    if (bVar1) {
                      TestSuite::_msg("enable batch size hint with negative value\n");
                      local_a80 = local_4c8;
                      local_a88._M_current =
                           (RaftAsioPkg **)
                           std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
                                     ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                                      in_stack_ffffffffffffdd48);
                      local_a90 = (RaftAsioPkg **)
                                  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                                            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>
                                              *)in_stack_ffffffffffffdd48);
                      while (bVar1 = __gnu_cxx::operator!=
                                               ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                                                 *)in_stack_ffffffffffffdd50,
                                                (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                                                 *)in_stack_ffffffffffffdd48), bVar1) {
                        ppRVar6 = __gnu_cxx::
                                  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                                  ::operator*(&local_a88);
                        local_a98 = *ppRVar6;
                        RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19c9ed);
                        raft_functional_common::TestSm::set_next_batch_size_hint_in_bytes
                                  (in_stack_ffffffffffffdd50,(ulong)in_stack_ffffffffffffdd48);
                        __gnu_cxx::
                        __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                        ::operator++(&local_a88);
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_ab8,"wait peer\'s hint size info refreshed in leader side",
                                 &local_ab9);
                      TestSuite::sleep_sec
                                ((size_t)in_stack_ffffffffffffdd50,
                                 (string *)in_stack_ffffffffffffdd48);
                      std::__cxx11::string::~string(local_ab8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
                      std::
                      __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x19ca8c);
                      nuraft::raft_server::get_current_params(in_stack_ffffffffffffdd60);
                      nuraft::raft_params::with_client_req_timeout(&local_b24,1000);
                      std::
                      __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x19cabf);
                      nuraft::raft_server::update_params
                                (in_stack_ffffffffffffddc0,(raft_params *)in_stack_ffffffffffffddb8)
                      ;
                      local_b30 = 0;
                      while( true ) {
                        if (2 < local_b30) break;
                        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffdd88);
                        std::operator+((char *)in_stack_ffffffffffffdd58,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffffdd50);
                        std::__cxx11::string::~string(local_b70);
                        std::__cxx11::string::size();
                        nuraft::buffer::alloc(in_stack_ffffffffffffde98);
                        nuraft::buffer_serializer::buffer_serializer
                                  ((buffer_serializer *)in_stack_ffffffffffffdd60,
                                   (ptr<buffer> *)in_stack_ffffffffffffdd58,
                                   (endianness)((ulong)in_stack_ffffffffffffdd50 >> 0x20));
                        nuraft::buffer_serializer::put_str
                                  ((buffer_serializer *)in_stack_ffffffffffffdd60,
                                   (string *)in_stack_ffffffffffffdd58);
                        std::
                        __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x19cb8e);
                        std::shared_ptr<nuraft::buffer>::shared_ptr
                                  ((shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffdd50,
                                   (shared_ptr<nuraft::buffer> *)in_stack_ffffffffffffdd48);
                        local_bc8 = 1;
                        local_bd0 = (undefined1 ****)local_be0;
                        std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
                                  ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x19cbe4);
                        __l_02._M_len._0_4_ = in_stack_ffffffffffffdd90;
                        __l_02._M_array = (iterator)in_stack_ffffffffffffdd88;
                        __l_02._M_len._4_4_ = in_stack_ffffffffffffdd94;
                        std::
                        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                  *)in_stack_ffffffffffffdd80,__l_02,
                                 (allocator_type *)
                                 CONCAT44(in_stack_ffffffffffffdd7c,in_stack_ffffffffffffdd78));
                        nuraft::raft_server::append_entries
                                  (in_stack_ffffffffffffddb8,in_stack_ffffffffffffddb0);
                        std::
                        shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                        ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                                       *)0x19cc37);
                        std::
                        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                   *)in_stack_ffffffffffffdd60);
                        std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
                                  ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x19cc51);
                        local_1a58 = &local_bd0;
                        do {
                          local_1a58 = local_1a58 + -2;
                          std::shared_ptr<nuraft::buffer>::~shared_ptr
                                    ((shared_ptr<nuraft::buffer> *)0x19cc86);
                        } while (local_1a58 != local_be0);
                        std::shared_ptr<nuraft::buffer>::~shared_ptr
                                  ((shared_ptr<nuraft::buffer> *)0x19ccb0);
                        std::__cxx11::string::~string(local_b50);
                        local_b30 = local_b30 + 1;
                      }
                      std::allocator<char>::allocator();
                      check_precommit = (undefined1)(in_stack_ffffffffffffde98 >> 0x38);
                      std::__cxx11::string::string
                                (local_c08,"wait for replication but actually no replication happen"
                                 ,&local_c09);
                      TestSuite::sleep_sec
                                ((size_t)in_stack_ffffffffffffdd50,
                                 (string *)in_stack_ffffffffffffdd48);
                      std::__cxx11::string::~string(local_c08);
                      std::allocator<char>::~allocator((allocator<char> *)&local_c09);
                      RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19ce9c);
                      RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19ceb3);
                      bVar1 = raft_functional_common::TestSm::isSame
                                        (in_stack_ffffffffffffdea8,
                                         (TestSm *)
                                         CONCAT44(in_stack_ffffffffffffdea4,
                                                  in_stack_ffffffffffffdea0),(bool)check_precommit);
                      if (bVar1) {
                        RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19d41b);
                        pTVar7 = RaftAsioPkg::getTestSm((RaftAsioPkg *)0x19d432);
                        iVar2 = (int)pTVar7;
                        bVar1 = raft_functional_common::TestSm::isSame
                                          (in_stack_ffffffffffffdea8,
                                           (TestSm *)
                                           CONCAT44(in_stack_ffffffffffffdea4,
                                                    in_stack_ffffffffffffdea0),(bool)check_precommit
                                          );
                        if (bVar1) {
                          if ((local_c5 & 1) != 0) {
                            local_c74 = 0;
                            local_8 = local_500;
                            local_c = 5;
                            local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                            local_c78 = (int)local_500[0]._M_id._M_thread;
                            if (local_c78 <= local_c74) {
                              poVar3 = (ostream *)
                                       std::ostream::operator<<
                                                 (&std::cout,std::endl<char,std::char_traits<char>>)
                              ;
                              poVar3 = std::operator<<(poVar3,"        time: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar3 = std::operator<<(poVar3,local_c98);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"      thread: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[33m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                              local_cd0._52_4_ = std::setw(4);
                              poVar3 = std::operator<<(poVar3,(_Setw)local_cd0._52_4_);
                              local_cd0[0x33] = (string)std::setfill<char>('0');
                              poVar3 = std::operator<<(poVar3,local_cd0[0x33]);
                              local_cd0._40_8_ = std::this_thread::get_id();
                              sVar4 = std::hash<std::thread::id>::operator()
                                                ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                                 (id *)in_stack_ffffffffffffdd48);
                              pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                              poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          in: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[36m");
                              poVar3 = std::operator<<(poVar3,"response_hint_test");
                              poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          at: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[32m");
                              poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                              poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2db);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"    expected: ");
                              poVar3 = std::operator<<(poVar3,
                                                  "\x1b[1;34mread_req_cb_count.load() > 0\x1b[0m\n")
                              ;
                              poVar3 = std::operator<<(poVar3,"    value of ");
                              poVar3 = std::operator<<(poVar3,
                                                  "\x1b[1;32mread_req_cb_count.load()\x1b[0m: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c78);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                              poVar3 = std::operator<<(poVar3,"    value of ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;32m0\x1b[0m: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c74);
                              std::operator<<(poVar3,"\x1b[0m\n");
                              std::__cxx11::string::~string(local_c98);
                              TestSuite::failHandler();
                              local_c4 = -1;
                              goto LAB_0019f5e1;
                            }
                            local_cd0[0x24] = (string)0x0;
                            local_cd0[0x25] = (string)0x0;
                            local_cd0[0x26] = (string)0x0;
                            local_cd0[0x27] = (string)0x0;
                            local_20 = (_Base_ptr)(local_518 + 0x10);
                            local_24 = 5;
                            local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                            local_cd0._32_4_ = local_518._16_4_;
                            if ((int)local_518._16_4_ <= (int)local_cd0._36_4_) {
                              poVar3 = (ostream *)
                                       std::ostream::operator<<
                                                 (&std::cout,std::endl<char,std::char_traits<char>>)
                              ;
                              poVar3 = std::operator<<(poVar3,"        time: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar3 = std::operator<<(poVar3,local_cd0);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"      thread: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[33m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                              local_d08._52_4_ = std::setw(4);
                              poVar3 = std::operator<<(poVar3,(_Setw)local_d08._52_4_);
                              local_d08[0x33] = (string)std::setfill<char>('0');
                              poVar3 = std::operator<<(poVar3,local_d08[0x33]);
                              local_d08._40_8_ = std::this_thread::get_id();
                              sVar4 = std::hash<std::thread::id>::operator()
                                                ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                                 (id *)in_stack_ffffffffffffdd48);
                              pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                              poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          in: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[36m");
                              poVar3 = std::operator<<(poVar3,"response_hint_test");
                              poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          at: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[32m");
                              poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                              poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2dc);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"    expected: ");
                              poVar3 = std::operator<<(poVar3,
                                                  "\x1b[1;34mwrite_req_cb_count.load() > 0\x1b[0m\n"
                                                  );
                              poVar3 = std::operator<<(poVar3,"    value of ");
                              poVar3 = std::operator<<(poVar3,
                                                  "\x1b[1;32mwrite_req_cb_count.load()\x1b[0m: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_cd0._32_4_);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                              poVar3 = std::operator<<(poVar3,"    value of ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;32m0\x1b[0m: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_cd0._36_4_);
                              std::operator<<(poVar3,"\x1b[0m\n");
                              std::__cxx11::string::~string(local_cd0);
                              TestSuite::failHandler();
                              local_c4 = -1;
                              goto LAB_0019f5e1;
                            }
                            local_d08[0x24] = (string)0x0;
                            local_d08[0x25] = (string)0x0;
                            local_d08[0x26] = (string)0x0;
                            local_d08[0x27] = (string)0x0;
                            local_38 = local_518 + 8;
                            local_3c = 5;
                            local_40 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                            local_d08._32_4_ = local_518._8_4_;
                            if ((int)local_518._8_4_ <= (int)local_d08._36_4_) {
                              poVar3 = (ostream *)
                                       std::ostream::operator<<
                                                 (&std::cout,std::endl<char,std::char_traits<char>>)
                              ;
                              poVar3 = std::operator<<(poVar3,"        time: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar3 = std::operator<<(poVar3,local_d08);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"      thread: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[33m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                              local_d0c = (int)std::setw(4);
                              poVar3 = std::operator<<(poVar3,(_Setw)local_d0c);
                              local_d0d = (char)std::setfill<char>('0');
                              poVar3 = std::operator<<(poVar3,local_d0d);
                              local_d18 = (native_handle_type)std::this_thread::get_id();
                              sVar4 = std::hash<std::thread::id>::operator()
                                                ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                                 (id *)in_stack_ffffffffffffdd48);
                              pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                              poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          in: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[36m");
                              poVar3 = std::operator<<(poVar3,"response_hint_test");
                              poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          at: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[32m");
                              poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                              poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2dd);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"    expected: ");
                              poVar3 = std::operator<<(poVar3,
                                                  "\x1b[1;34mread_resp_cb_count.load() > 0\x1b[0m\n"
                                                  );
                              poVar3 = std::operator<<(poVar3,"    value of ");
                              poVar3 = std::operator<<(poVar3,
                                                  "\x1b[1;32mread_resp_cb_count.load()\x1b[0m: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d08._32_4_);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                              poVar3 = std::operator<<(poVar3,"    value of ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;32m0\x1b[0m: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d08._36_4_);
                              std::operator<<(poVar3,"\x1b[0m\n");
                              std::__cxx11::string::~string(local_d08);
                              TestSuite::failHandler();
                              local_c4 = -1;
                              goto LAB_0019f5e1;
                            }
                            local_d1c = 0;
                            local_68.__data.__list.__prev = (__pthread_internal_list *)local_518;
                            local_68._20_4_ = 5;
                            local_68.__data.__kind =
                                 std::operator&(memory_order_seq_cst,__memory_order_mask);
                            local_d20 = local_518._0_4_;
                            if ((int)local_518._0_4_ <= local_d1c) {
                              poVar3 = (ostream *)
                                       std::ostream::operator<<
                                                 (&std::cout,std::endl<char,std::char_traits<char>>)
                              ;
                              poVar3 = std::operator<<(poVar3,"        time: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                              TestSuite::getTimeString_abi_cxx11_();
                              poVar3 = std::operator<<(poVar3,local_d40);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"      thread: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[33m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                              local_d44 = (int)std::setw(4);
                              poVar3 = std::operator<<(poVar3,(_Setw)local_d44);
                              local_d45 = (char)std::setfill<char>('0');
                              poVar3 = std::operator<<(poVar3,local_d45);
                              local_d50 = (native_handle_type)std::this_thread::get_id();
                              sVar4 = std::hash<std::thread::id>::operator()
                                                ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                                 (id *)in_stack_ffffffffffffdd48);
                              pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                              poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          in: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[36m");
                              poVar3 = std::operator<<(poVar3,"response_hint_test");
                              poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"          at: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[32m");
                              poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                              poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2de);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m");
                              poVar3 = std::operator<<(poVar3,"\n");
                              poVar3 = std::operator<<(poVar3,"    expected: ");
                              poVar3 = std::operator<<(poVar3,
                                                  "\x1b[1;34mwrite_resp_cb_count.load() > 0\x1b[0m\n"
                                                  );
                              poVar3 = std::operator<<(poVar3,"    value of ");
                              poVar3 = std::operator<<(poVar3,
                                                  "\x1b[1;32mwrite_resp_cb_count.load()\x1b[0m: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d20);
                              poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                              poVar3 = std::operator<<(poVar3,"    value of ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;32m0\x1b[0m: ");
                              poVar3 = std::operator<<(poVar3,"\x1b[1;31m");
                              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d1c);
                              std::operator<<(poVar3,"\x1b[0m\n");
                              std::__cxx11::string::~string(local_d40);
                              TestSuite::failHandler();
                              local_c4 = -1;
                              goto LAB_0019f5e1;
                            }
                            local_68.__align = (long)local_500;
                            local_90._36_4_ = 5;
                            local_90._32_4_ =
                                 std::operator&(memory_order_seq_cst,__memory_order_mask);
                            plVar11 = (long *)(local_518 + 0x10);
                            local_90.__data.__nusers = 5;
                            local_90._16_8_ = plVar11;
                            local_90.__data.__owner =
                                 std::operator&(memory_order_seq_cst,__memory_order_mask);
                            if (local_90.__data.__nusers - 1 < 2) {
                              local_90.__align = *plVar11;
                            }
                            else if (local_90.__data.__nusers == 5) {
                              local_90.__align = *plVar11;
                            }
                            else {
                              local_90.__align = *plVar11;
                            }
                            TestSuite::_msg("read req callback %zu, write req callback %zu\n",
                                            local_500[0]._M_id._M_thread,local_90.__align);
                            p_Var10 = (__pthread_internal_list *)(local_518 + 8);
                            local_b8._28_4_ = 5;
                            local_b8.__data.__list.__next = p_Var10;
                            local_b8._24_4_ =
                                 std::operator&(memory_order_seq_cst,__memory_order_mask);
                            if (local_b8._28_4_ - 1 < 2) {
                              local_b8._16_8_ = p_Var10->__prev;
                            }
                            else if (local_b8._28_4_ == 5) {
                              local_b8._16_8_ = p_Var10->__prev;
                            }
                            else {
                              local_b8._16_8_ = p_Var10->__prev;
                            }
                            in_stack_ffffffffffffdd60 = (raft_server *)local_518;
                            local_b8.__data.__count = 5;
                            uVar9 = local_b8._16_8_;
                            local_b8._8_8_ = in_stack_ffffffffffffdd60;
                            local_b8.__data.__lock =
                                 std::operator&(memory_order_seq_cst,__memory_order_mask);
                            if (local_b8.__data.__count - 1 < 2) {
                              local_c0 = in_stack_ffffffffffffdd60->_vptr_raft_server;
                            }
                            else if (local_b8.__data.__count == 5) {
                              local_c0 = in_stack_ffffffffffffdd60->_vptr_raft_server;
                            }
                            else {
                              local_c0 = in_stack_ffffffffffffdd60->_vptr_raft_server;
                            }
                            TestSuite::_msg("read resp callback %zu, write resp callback %zu\n",
                                            uVar9,local_c0);
                            iVar2 = (int)uVar9;
                          }
                          peVar8 = std::
                                   __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)0x19f4e9);
                          nuraft::raft_server::shutdown(peVar8,iVar2,__how);
                          peVar8 = std::
                                   __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)0x19f500);
                          nuraft::raft_server::shutdown(peVar8,iVar2,__how_00);
                          peVar8 = std::
                                   __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)0x19f517);
                          nuraft::raft_server::shutdown(peVar8,iVar2,__how_01);
                          in_stack_ffffffffffffdd50 = (TestSm *)local_d71;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)(local_d71 + 1),"shutting down",
                                     (allocator *)in_stack_ffffffffffffdd50);
                          iVar2 = (int)local_d71 + 1;
                          TestSuite::sleep_sec
                                    ((size_t)in_stack_ffffffffffffdd50,
                                     (string *)in_stack_ffffffffffffdd48);
                          std::__cxx11::string::~string((string *)(local_d71 + 1));
                          this = (allocator<char> *)local_d71;
                          std::allocator<char>::~allocator(this);
                          SimpleLogger::shutdown((int)this,iVar2);
                          local_c4 = 0;
                        }
                        else {
                          poVar3 = (ostream *)
                                   std::ostream::operator<<
                                             (&std::cout,std::endl<char,std::char_traits<char>>);
                          poVar3 = std::operator<<(poVar3,"        time: ");
                          poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                          TestSuite::getTimeString_abi_cxx11_();
                          poVar3 = std::operator<<(poVar3,local_c60);
                          poVar3 = std::operator<<(poVar3,"\x1b[0m");
                          poVar3 = std::operator<<(poVar3,"\n");
                          poVar3 = std::operator<<(poVar3,"      thread: ");
                          poVar3 = std::operator<<(poVar3,"\x1b[33m");
                          poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                          local_c64 = (int)std::setw(4);
                          poVar3 = std::operator<<(poVar3,(_Setw)local_c64);
                          local_c65 = (char)std::setfill<char>('0');
                          poVar3 = std::operator<<(poVar3,local_c65);
                          local_c70 = (native_handle_type)std::this_thread::get_id();
                          sVar4 = std::hash<std::thread::id>::operator()
                                            ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                             (id *)in_stack_ffffffffffffdd48);
                          pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                          poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                          poVar3 = std::operator<<(poVar3,"\x1b[0m");
                          poVar3 = std::operator<<(poVar3,"\n");
                          poVar3 = std::operator<<(poVar3,"          in: ");
                          poVar3 = std::operator<<(poVar3,"\x1b[36m");
                          poVar3 = std::operator<<(poVar3,"response_hint_test");
                          poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                          poVar3 = std::operator<<(poVar3,"\n");
                          poVar3 = std::operator<<(poVar3,"          at: ");
                          poVar3 = std::operator<<(poVar3,"\x1b[32m");
                          poVar3 = std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                          poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                          poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2d7);
                          poVar3 = std::operator<<(poVar3,"\x1b[0m");
                          poVar3 = std::operator<<(poVar3,"\n");
                          poVar3 = std::operator<<(poVar3,
                                                  "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                                  );
                          poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                          poVar3 = std::operator<<(poVar3,"true");
                          poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                          poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                          poVar3 = std::operator<<(poVar3,"false");
                          std::operator<<(poVar3,"\x1b[0m\n");
                          std::__cxx11::string::~string(local_c60);
                          TestSuite::failHandler();
                          local_c4 = -1;
                        }
                      }
                      else {
                        poVar3 = (ostream *)
                                 std::ostream::operator<<
                                           (&std::cout,std::endl<char,std::char_traits<char>>);
                        poVar3 = std::operator<<(poVar3,"        time: ");
                        poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                        TestSuite::getTimeString_abi_cxx11_();
                        poVar3 = std::operator<<(poVar3,local_c30);
                        poVar3 = std::operator<<(poVar3,"\x1b[0m");
                        poVar3 = std::operator<<(poVar3,"\n");
                        poVar3 = std::operator<<(poVar3,"      thread: ");
                        poVar3 = std::operator<<(poVar3,"\x1b[33m");
                        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                        local_c60._44_4_ = std::setw(4);
                        poVar3 = std::operator<<(poVar3,(_Setw)local_c60._44_4_);
                        local_c60[0x2b] = (string)std::setfill<char>('0');
                        poVar3 = std::operator<<(poVar3,local_c60[0x2b]);
                        local_c60._32_8_ = std::this_thread::get_id();
                        sVar4 = std::hash<std::thread::id>::operator()
                                          ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                           (id *)in_stack_ffffffffffffdd48);
                        pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                        poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                        poVar3 = std::operator<<(poVar3,"\x1b[0m");
                        poVar3 = std::operator<<(poVar3,"\n");
                        poVar3 = std::operator<<(poVar3,"          in: ");
                        poVar3 = std::operator<<(poVar3,"\x1b[36m");
                        poVar3 = std::operator<<(poVar3,"response_hint_test");
                        poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                        poVar3 = std::operator<<(poVar3,"\n");
                        poVar3 = std::operator<<(poVar3,"          at: ");
                        poVar3 = std::operator<<(poVar3,"\x1b[32m");
                        poVar3 = std::operator<<(poVar3,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                );
                        poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                        poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2d6);
                        poVar3 = std::operator<<(poVar3,"\x1b[0m");
                        poVar3 = std::operator<<(poVar3,"\n");
                        poVar3 = std::operator<<(poVar3,
                                                 "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                                );
                        poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                        poVar3 = std::operator<<(poVar3,"true");
                        poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                        poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                        poVar3 = std::operator<<(poVar3,"false");
                        std::operator<<(poVar3,"\x1b[0m\n");
                        std::__cxx11::string::~string(local_c30);
                        TestSuite::failHandler();
                        local_c4 = -1;
                      }
                    }
                    else {
                      poVar3 = (ostream *)
                               std::ostream::operator<<
                                         (&std::cout,std::endl<char,std::char_traits<char>>);
                      poVar3 = std::operator<<(poVar3,"        time: ");
                      poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                      TestSuite::getTimeString_abi_cxx11_();
                      poVar3 = std::operator<<(poVar3,local_a68);
                      poVar3 = std::operator<<(poVar3,"\x1b[0m");
                      poVar3 = std::operator<<(poVar3,"\n");
                      poVar3 = std::operator<<(poVar3,"      thread: ");
                      poVar3 = std::operator<<(poVar3,"\x1b[33m");
                      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                      local_a6c = (int)std::setw(4);
                      poVar3 = std::operator<<(poVar3,(_Setw)local_a6c);
                      local_a6d = (char)std::setfill<char>('0');
                      poVar3 = std::operator<<(poVar3,local_a6d);
                      local_a78 = (native_handle_type)std::this_thread::get_id();
                      sVar4 = std::hash<std::thread::id>::operator()
                                        ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                         (id *)in_stack_ffffffffffffdd48);
                      pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                      poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                      poVar3 = std::operator<<(poVar3,"\x1b[0m");
                      poVar3 = std::operator<<(poVar3,"\n");
                      poVar3 = std::operator<<(poVar3,"          in: ");
                      poVar3 = std::operator<<(poVar3,"\x1b[36m");
                      poVar3 = std::operator<<(poVar3,"response_hint_test");
                      poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                      poVar3 = std::operator<<(poVar3,"\n");
                      poVar3 = std::operator<<(poVar3,"          at: ");
                      poVar3 = std::operator<<(poVar3,"\x1b[32m");
                      poVar3 = std::operator<<(poVar3,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                              );
                      poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                      poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2bd);
                      poVar3 = std::operator<<(poVar3,"\x1b[0m");
                      poVar3 = std::operator<<(poVar3,"\n");
                      poVar3 = std::operator<<(poVar3,
                                               "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                              );
                      poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                      poVar3 = std::operator<<(poVar3,"true");
                      poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                      poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                      poVar3 = std::operator<<(poVar3,"false");
                      std::operator<<(poVar3,"\x1b[0m\n");
                      std::__cxx11::string::~string(local_a68);
                      TestSuite::failHandler();
                      local_c4 = -1;
                    }
                  }
                  else {
                    poVar3 = (ostream *)
                             std::ostream::operator<<
                                       (&std::cout,std::endl<char,std::char_traits<char>>);
                    poVar3 = std::operator<<(poVar3,"        time: ");
                    poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar3 = std::operator<<(poVar3,local_a38);
                    poVar3 = std::operator<<(poVar3,"\x1b[0m");
                    poVar3 = std::operator<<(poVar3,"\n");
                    poVar3 = std::operator<<(poVar3,"      thread: ");
                    poVar3 = std::operator<<(poVar3,"\x1b[33m");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                    local_a3c = (int)std::setw(4);
                    poVar3 = std::operator<<(poVar3,(_Setw)local_a3c);
                    local_a3d = (char)std::setfill<char>('0');
                    poVar3 = std::operator<<(poVar3,local_a3d);
                    local_a48 = (native_handle_type)std::this_thread::get_id();
                    sVar4 = std::hash<std::thread::id>::operator()
                                      ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                       (id *)in_stack_ffffffffffffdd48);
                    pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                    poVar3 = std::operator<<(poVar3,"\x1b[0m");
                    poVar3 = std::operator<<(poVar3,"\n");
                    poVar3 = std::operator<<(poVar3,"          in: ");
                    poVar3 = std::operator<<(poVar3,"\x1b[36m");
                    poVar3 = std::operator<<(poVar3,"response_hint_test");
                    poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                    poVar3 = std::operator<<(poVar3,"\n");
                    poVar3 = std::operator<<(poVar3,"          at: ");
                    poVar3 = std::operator<<(poVar3,"\x1b[32m");
                    poVar3 = std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                            );
                    poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                    poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,700);
                    poVar3 = std::operator<<(poVar3,"\x1b[0m");
                    poVar3 = std::operator<<(poVar3,"\n");
                    poVar3 = std::operator<<(poVar3,
                                             "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                            );
                    poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                    poVar3 = std::operator<<(poVar3,"true");
                    poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                    poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                    poVar3 = std::operator<<(poVar3,"false");
                    std::operator<<(poVar3,"\x1b[0m\n");
                    std::__cxx11::string::~string(local_a38);
                    TestSuite::failHandler();
                    local_c4 = -1;
                  }
                }
                else {
                  poVar3 = (ostream *)
                           std::ostream::operator<<
                                     (&std::cout,std::endl<char,std::char_traits<char>>);
                  poVar3 = std::operator<<(poVar3,"        time: ");
                  poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar3 = std::operator<<(poVar3,local_900);
                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                  poVar3 = std::operator<<(poVar3,"\n");
                  poVar3 = std::operator<<(poVar3,"      thread: ");
                  poVar3 = std::operator<<(poVar3,"\x1b[33m");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                  local_904 = (int)std::setw(4);
                  poVar3 = std::operator<<(poVar3,(_Setw)local_904);
                  local_905 = (char)std::setfill<char>('0');
                  poVar3 = std::operator<<(poVar3,local_905);
                  local_910 = (native_handle_type)std::this_thread::get_id();
                  sVar4 = std::hash<std::thread::id>::operator()
                                    ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                     (id *)in_stack_ffffffffffffdd48);
                  pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                  poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                  poVar3 = std::operator<<(poVar3,"\n");
                  poVar3 = std::operator<<(poVar3,"          in: ");
                  poVar3 = std::operator<<(poVar3,"\x1b[36m");
                  poVar3 = std::operator<<(poVar3,"response_hint_test");
                  poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                  poVar3 = std::operator<<(poVar3,"\n");
                  poVar3 = std::operator<<(poVar3,"          at: ");
                  poVar3 = std::operator<<(poVar3,"\x1b[32m");
                  poVar3 = std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                          );
                  poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                  poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2ab);
                  poVar3 = std::operator<<(poVar3,"\x1b[0m");
                  poVar3 = std::operator<<(poVar3,"\n");
                  poVar3 = std::operator<<(poVar3,
                                           "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                          );
                  poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                  poVar3 = std::operator<<(poVar3,"true");
                  poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                  poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                  poVar3 = std::operator<<(poVar3,"false");
                  std::operator<<(poVar3,"\x1b[0m\n");
                  std::__cxx11::string::~string(local_900);
                  TestSuite::failHandler();
                  local_c4 = -1;
                }
              }
              else {
                poVar3 = (ostream *)
                         std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>)
                ;
                poVar3 = std::operator<<(poVar3,"        time: ");
                poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar3 = std::operator<<(poVar3,local_8d0);
                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                poVar3 = std::operator<<(poVar3,"\n");
                poVar3 = std::operator<<(poVar3,"      thread: ");
                poVar3 = std::operator<<(poVar3,"\x1b[33m");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
                local_8d4 = (int)std::setw(4);
                poVar3 = std::operator<<(poVar3,(_Setw)local_8d4);
                local_8d5 = (char)std::setfill<char>('0');
                poVar3 = std::operator<<(poVar3,local_8d5);
                local_8e0 = (native_handle_type)std::this_thread::get_id();
                sVar4 = std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                   (id *)in_stack_ffffffffffffdd48);
                pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
                poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                poVar3 = std::operator<<(poVar3,"\n");
                poVar3 = std::operator<<(poVar3,"          in: ");
                poVar3 = std::operator<<(poVar3,"\x1b[36m");
                poVar3 = std::operator<<(poVar3,"response_hint_test");
                poVar3 = std::operator<<(poVar3,"()\x1b[0m");
                poVar3 = std::operator<<(poVar3,"\n");
                poVar3 = std::operator<<(poVar3,"          at: ");
                poVar3 = std::operator<<(poVar3,"\x1b[32m");
                poVar3 = std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                        );
                poVar3 = std::operator<<(poVar3,"\x1b[0m:");
                poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2aa);
                poVar3 = std::operator<<(poVar3,"\x1b[0m");
                poVar3 = std::operator<<(poVar3,"\n");
                poVar3 = std::operator<<(poVar3,
                                         "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                                        );
                poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
                poVar3 = std::operator<<(poVar3,"true");
                poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
                poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
                poVar3 = std::operator<<(poVar3,"false");
                std::operator<<(poVar3,"\x1b[0m\n");
                std::__cxx11::string::~string(local_8d0);
                TestSuite::failHandler();
                local_c4 = -1;
              }
            }
            else {
              poVar3 = (ostream *)
                       std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              poVar3 = std::operator<<(poVar3,"        time: ");
              poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
              TestSuite::getTimeString_abi_cxx11_();
              poVar3 = std::operator<<(poVar3,local_7a8);
              poVar3 = std::operator<<(poVar3,"\x1b[0m");
              poVar3 = std::operator<<(poVar3,"\n");
              poVar3 = std::operator<<(poVar3,"      thread: ");
              poVar3 = std::operator<<(poVar3,"\x1b[33m");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
              local_7ac = (int)std::setw(4);
              poVar3 = std::operator<<(poVar3,(_Setw)local_7ac);
              local_7ad = (char)std::setfill<char>('0');
              poVar3 = std::operator<<(poVar3,local_7ad);
              local_7b8 = (native_handle_type)std::this_thread::get_id();
              sVar4 = std::hash<std::thread::id>::operator()
                                ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                                 (id *)in_stack_ffffffffffffdd48);
              pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
              poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
              poVar3 = std::operator<<(poVar3,"\x1b[0m");
              poVar3 = std::operator<<(poVar3,"\n");
              poVar3 = std::operator<<(poVar3,"          in: ");
              poVar3 = std::operator<<(poVar3,"\x1b[36m");
              poVar3 = std::operator<<(poVar3,"response_hint_test");
              poVar3 = std::operator<<(poVar3,"()\x1b[0m");
              poVar3 = std::operator<<(poVar3,"\n");
              poVar3 = std::operator<<(poVar3,"          at: ");
              poVar3 = std::operator<<(poVar3,"\x1b[32m");
              poVar3 = std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                      );
              poVar3 = std::operator<<(poVar3,"\x1b[0m:");
              poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x29c);
              poVar3 = std::operator<<(poVar3,"\x1b[0m");
              poVar3 = std::operator<<(poVar3,"\n");
              poVar3 = std::operator<<(poVar3,
                                       "    value of: \x1b[1;34ms3.raftServer->get_leader()\x1b[0m\n"
                                      );
              poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_784);
              poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
              poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_788);
              std::operator<<(poVar3,"\x1b[0m\n");
              std::__cxx11::string::~string(local_7a8);
              TestSuite::failHandler();
              local_c4 = -1;
            }
          }
          else {
            poVar3 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<(poVar3,"        time: ");
            poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar3 = std::operator<<(poVar3,local_770);
            poVar3 = std::operator<<(poVar3,"\x1b[0m");
            poVar3 = std::operator<<(poVar3,"\n");
            poVar3 = std::operator<<(poVar3,"      thread: ");
            poVar3 = std::operator<<(poVar3,"\x1b[33m");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
            local_774 = (int)std::setw(4);
            poVar3 = std::operator<<(poVar3,(_Setw)local_774);
            local_775 = (char)std::setfill<char>('0');
            poVar3 = std::operator<<(poVar3,local_775);
            local_780 = (native_handle_type)std::this_thread::get_id();
            sVar4 = std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                               (id *)in_stack_ffffffffffffdd48);
            pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
            poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
            poVar3 = std::operator<<(poVar3,"\x1b[0m");
            poVar3 = std::operator<<(poVar3,"\n");
            poVar3 = std::operator<<(poVar3,"          in: ");
            poVar3 = std::operator<<(poVar3,"\x1b[36m");
            poVar3 = std::operator<<(poVar3,"response_hint_test");
            poVar3 = std::operator<<(poVar3,"()\x1b[0m");
            poVar3 = std::operator<<(poVar3,"\n");
            poVar3 = std::operator<<(poVar3,"          at: ");
            poVar3 = std::operator<<(poVar3,"\x1b[32m");
            poVar3 = std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar3 = std::operator<<(poVar3,"\x1b[0m:");
            poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x29b);
            poVar3 = std::operator<<(poVar3,"\x1b[0m");
            poVar3 = std::operator<<(poVar3,"\n");
            poVar3 = std::operator<<(poVar3,
                                     "    value of: \x1b[1;34ms2.raftServer->get_leader()\x1b[0m\n")
            ;
            poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_74c);
            poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
            poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_750);
            std::operator<<(poVar3,"\x1b[0m\n");
            std::__cxx11::string::~string(local_770);
            TestSuite::failHandler();
            local_c4 = -1;
          }
        }
        else {
          poVar3 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<(poVar3,"        time: ");
          poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar3 = std::operator<<(poVar3,local_738);
          poVar3 = std::operator<<(poVar3,"\x1b[0m");
          poVar3 = std::operator<<(poVar3,"\n");
          poVar3 = std::operator<<(poVar3,"      thread: ");
          poVar3 = std::operator<<(poVar3,"\x1b[33m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
          local_73c = (int)std::setw(4);
          poVar3 = std::operator<<(poVar3,(_Setw)local_73c);
          local_73d = (char)std::setfill<char>('0');
          poVar3 = std::operator<<(poVar3,local_73d);
          local_748 = (native_handle_type)std::this_thread::get_id();
          sVar4 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                             (id *)in_stack_ffffffffffffdd48);
          pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
          poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
          poVar3 = std::operator<<(poVar3,"\x1b[0m");
          poVar3 = std::operator<<(poVar3,"\n");
          poVar3 = std::operator<<(poVar3,"          in: ");
          poVar3 = std::operator<<(poVar3,"\x1b[36m");
          poVar3 = std::operator<<(poVar3,"response_hint_test");
          poVar3 = std::operator<<(poVar3,"()\x1b[0m");
          poVar3 = std::operator<<(poVar3,"\n");
          poVar3 = std::operator<<(poVar3,"          at: ");
          poVar3 = std::operator<<(poVar3,"\x1b[32m");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar3 = std::operator<<(poVar3,"\x1b[0m:");
          poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x29a);
          poVar3 = std::operator<<(poVar3,"\x1b[0m");
          poVar3 = std::operator<<(poVar3,"\n");
          poVar3 = std::operator<<(poVar3,
                                   "    value of: \x1b[1;34ms1.raftServer->get_leader()\x1b[0m\n");
          poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_714);
          poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
          poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_718);
          std::operator<<(poVar3,"\x1b[0m\n");
          std::__cxx11::string::~string(local_738);
          TestSuite::failHandler();
          local_c4 = -1;
        }
      }
      else {
        poVar3 = (ostream *)
                 std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"        time: ");
        poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar3 = std::operator<<(poVar3,local_700);
        poVar3 = std::operator<<(poVar3,"\x1b[0m");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"      thread: ");
        poVar3 = std::operator<<(poVar3,"\x1b[33m");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        local_704 = (int)std::setw(4);
        poVar3 = std::operator<<(poVar3,(_Setw)local_704);
        local_705 = (char)std::setfill<char>('0');
        poVar3 = std::operator<<(poVar3,local_705);
        local_710 = (native_handle_type)std::this_thread::get_id();
        sVar4 = std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                           (id *)in_stack_ffffffffffffdd48);
        pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
        poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
        poVar3 = std::operator<<(poVar3,"\x1b[0m");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"          in: ");
        poVar3 = std::operator<<(poVar3,"\x1b[36m");
        poVar3 = std::operator<<(poVar3,"response_hint_test");
        poVar3 = std::operator<<(poVar3,"()\x1b[0m");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"          at: ");
        poVar3 = std::operator<<(poVar3,"\x1b[32m");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                );
        poVar3 = std::operator<<(poVar3,"\x1b[0m:");
        poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x299);
        poVar3 = std::operator<<(poVar3,"\x1b[0m");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,
                                 "    value of: \x1b[1;34ms1.raftServer->is_leader()\x1b[0m\n");
        poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
        poVar3 = std::operator<<(poVar3,"true");
        poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
        poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
        poVar3 = std::operator<<(poVar3,"false");
        std::operator<<(poVar3,"\x1b[0m\n");
        std::__cxx11::string::~string(local_700);
        TestSuite::failHandler();
        local_c4 = -1;
      }
    }
    else {
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"        time: ");
      poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,local_6d0);
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"      thread: ");
      poVar3 = std::operator<<(poVar3,"\x1b[33m");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
      local_6d4 = (int)std::setw(4);
      poVar3 = std::operator<<(poVar3,(_Setw)local_6d4);
      local_6d5 = (char)std::setfill<char>('0');
      poVar3 = std::operator<<(poVar3,local_6d5);
      local_6e0 = (native_handle_type)std::this_thread::get_id();
      sVar4 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                         (id *)in_stack_ffffffffffffdd48);
      pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
      poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"          in: ");
      poVar3 = std::operator<<(poVar3,"\x1b[36m");
      poVar3 = std::operator<<(poVar3,"response_hint_test");
      poVar3 = std::operator<<(poVar3,"()\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"          at: ");
      poVar3 = std::operator<<(poVar3,"\x1b[32m");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar3 = std::operator<<(poVar3,"\x1b[0m:");
      poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x297);
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n");
      poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
      poVar3 = std::operator<<(poVar3,"0");
      poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
      poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_6ac);
      std::operator<<(poVar3,"\x1b[0m\n");
      std::__cxx11::string::~string(local_6d0);
      TestSuite::failHandler();
      local_c4 = -1;
    }
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"        time: ");
    poVar3 = std::operator<<(poVar3,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_670);
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"      thread: ");
    poVar3 = std::operator<<(poVar3,"\x1b[33m");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    local_674 = (int)std::setw(4);
    poVar3 = std::operator<<(poVar3,(_Setw)local_674);
    local_675 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_675);
    local_680 = (native_handle_type)std::this_thread::get_id();
    sVar4 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_ffffffffffffdd50,
                       (id *)in_stack_ffffffffffffdd48);
    pvVar5 = (void *)std::ostream::operator<<(poVar3,sVar4 & 0xffff);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"          in: ");
    poVar3 = std::operator<<(poVar3,"\x1b[36m");
    poVar3 = std::operator<<(poVar3,"response_hint_test");
    poVar3 = std::operator<<(poVar3,"()\x1b[0m");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"          at: ");
    poVar3 = std::operator<<(poVar3,"\x1b[32m");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar3 = std::operator<<(poVar3,"\x1b[0m:");
    poVar3 = std::operator<<(poVar3,"\x1b[1;35m");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28f);
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n");
    poVar3 = std::operator<<(poVar3,"    expected: \x1b[1;32m");
    poVar3 = std::operator<<(poVar3,"0");
    poVar3 = std::operator<<(poVar3,"\x1b[0m\n");
    poVar3 = std::operator<<(poVar3,"      actual: \x1b[1;31m");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_61c);
    std::operator<<(poVar3,"\x1b[0m\n");
    std::__cxx11::string::~string(local_670);
    TestSuite::failHandler();
    local_c4 = -1;
  }
LAB_0019f5e1:
  local_684 = 1;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_ffffffffffffdd60);
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)in_stack_ffffffffffffdd50);
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)in_stack_ffffffffffffdd50);
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)in_stack_ffffffffffffdd50);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_e8);
  return local_c4;
}

Assistant:

int response_hint_test(bool with_meta) {
    reset_log_files();

    std::string s1_addr = "localhost:20010";
    std::string s2_addr = "localhost:20020";
    std::string s3_addr = "localhost:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    _msg("launching asio-raft servers %s\n",
         with_meta ? "(with meta)" : "");
    std::atomic<size_t> read_req_cb_count(0);
    std::atomic<size_t> write_req_cb_count(0);
    std::atomic<size_t> read_resp_cb_count(0);
    std::atomic<size_t> write_resp_cb_count(0);
    for (RaftAsioPkg* ee: pkgs) {
        if (with_meta) {
            ee->setMetaCallback
                ( std::bind( test_read_req_meta,
                             &read_req_cb_count,
                             std::placeholders::_1,
                             std::placeholders::_2 ),
                  std::bind( test_write_req_meta,
                             &write_req_cb_count,
                             std::placeholders::_1 ),
                  std::bind( test_read_resp_meta,
                             &read_resp_cb_count,
                             std::placeholders::_1,
                             std::placeholders::_2 ),
                  std::bind( test_write_resp_meta,
                             &write_resp_cb_count,
                             std::placeholders::_1 ),
                  true );
        }
    }
    CHK_Z( launch_servers(pkgs, false) );

    _msg("enable batch size hint with positive value\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(1);
    }

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    CHK_TRUE( s1.raftServer->is_leader() );
    CHK_EQ(1, s1.raftServer->get_leader());
    CHK_EQ(1, s2.raftServer->get_leader());
    CHK_EQ(1, s3.raftServer->get_leader());
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    const size_t NUM = 100;
    for (size_t ii=0; ii<NUM; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    _msg("disable batch size hint\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(0);
    }

    for (size_t ii=0; ii<NUM; ++ii) {
        std::string msg_str = "2nd_" + std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    _msg("enable batch size hint with negative value\n");
    for (RaftAsioPkg* ee: pkgs) {
        ee->getTestSm()->set_next_batch_size_hint_in_bytes(-1);
    }

    TestSuite::sleep_sec(1, "wait peer's hint size info refreshed in leader side");

    // With negative hint size, append_entries will timeout due to
    // raft server can not commit. Set timeout to a small value.
    raft_params params = s1.raftServer->get_current_params();
    params.with_client_req_timeout(1000);
    s1.raftServer->update_params(params);

    for (size_t ii=0; ii<3; ++ii) {
        std::string msg_str = "3rd_" + std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication but actually no replication happen");

    // State machine should be identical. All are not committed.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    if (with_meta) {
        // Callback functions for meta should have been called.
        CHK_GT(read_req_cb_count.load(), 0);
        CHK_GT(write_req_cb_count.load(), 0);
        CHK_GT(read_resp_cb_count.load(), 0);
        CHK_GT(write_resp_cb_count.load(), 0);
        _msg( "read req callback %zu, write req callback %zu\n",
              read_req_cb_count.load(), write_req_cb_count.load() );
        _msg( "read resp callback %zu, write resp callback %zu\n",
              read_resp_cb_count.load(), write_resp_cb_count.load() );
    }

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}